

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

uint * __thiscall
fmt::v11::detail::allocator<unsigned_int>::allocate(allocator<unsigned_int> *this,size_t n)

{
  uint *puVar1;
  undefined8 *puVar2;
  
  if (n >> 0x3e != 0) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/build_O1/_deps/fmt-src/include/fmt/format.h"
                ,0x2ea,"");
  }
  puVar1 = (uint *)malloc(n << 2);
  if (puVar1 != (uint *)0x0) {
    return puVar1;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = &std::istream::typeinfo;
  __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

T* allocate(size_t n) {
    FMT_ASSERT(n <= max_value<size_t>() / sizeof(T), "");
    T* p = static_cast<T*>(malloc(n * sizeof(T)));
    if (!p) FMT_THROW(std::bad_alloc());
    return p;
  }